

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::VersionSet::GetRange
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs,
          InternalKey *smallest,InternalKey *largest)

{
  FileMetaData *pFVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  pointer ppFVar5;
  InternalKeyComparator *pIVar6;
  ulong uVar7;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  size_type local_38;
  
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!inputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x4a0,
                  "void leveldb::VersionSet::GetRange(const std::vector<FileMetaData *> &, InternalKey *, InternalKey *)"
                 );
  }
  (smallest->rep_)._M_string_length = 0;
  *(smallest->rep_)._M_dataplus._M_p = '\0';
  (largest->rep_)._M_string_length = 0;
  *(largest->rep_)._M_dataplus._M_p = '\0';
  ppFVar5 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    pIVar6 = &this->icmp_;
    uVar7 = 0;
    do {
      pFVar1 = ppFVar5[uVar7];
      if (uVar7 == 0) {
        std::__cxx11::string::_M_assign((string *)smallest);
LAB_0011ba56:
        std::__cxx11::string::_M_assign((string *)largest);
      }
      else {
        sVar2 = (pFVar1->smallest).rep_._M_string_length;
        if (sVar2 == 0) {
LAB_0011ba8e:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_40 = (pFVar1->smallest).rep_._M_dataplus._M_p;
        sVar3 = (smallest->rep_)._M_string_length;
        local_38 = sVar2;
        if (sVar3 == 0) goto LAB_0011ba8e;
        local_50 = (smallest->rep_)._M_dataplus._M_p;
        local_48 = sVar3;
        iVar4 = (*(pIVar6->super_Comparator)._vptr_Comparator[2])(pIVar6,&local_40,&local_50);
        if (iVar4 < 0) {
          std::__cxx11::string::_M_assign((string *)smallest);
        }
        sVar2 = (pFVar1->largest).rep_._M_string_length;
        if (sVar2 == 0) goto LAB_0011ba8e;
        local_40 = (pFVar1->largest).rep_._M_dataplus._M_p;
        sVar3 = (largest->rep_)._M_string_length;
        local_38 = sVar2;
        if (sVar3 == 0) goto LAB_0011ba8e;
        local_50 = (largest->rep_)._M_dataplus._M_p;
        local_48 = sVar3;
        iVar4 = (*(pIVar6->super_Comparator)._vptr_Comparator[2])(pIVar6,&local_40,&local_50);
        if (0 < iVar4) goto LAB_0011ba56;
      }
      uVar7 = uVar7 + 1;
      ppFVar5 = (inputs->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(inputs->
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)
            );
  }
  return;
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}